

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  sqlite3 *db;
  u8 *puVar1;
  u32 uVar2;
  u32 uVar3;
  int iVar4;
  u32 uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  u8 uVar10;
  uint uVar11;
  uint uVar12;
  Mem *pMVar13;
  uint uVar14;
  i64 val;
  sqlite3_context *val_00;
  code *xDel;
  uint uVar15;
  ulong uVar16;
  u8 *z;
  long in_FS_OFFSET;
  double r;
  sqlite3_int64 iRes;
  double local_118;
  u32 local_10c;
  JsonParse local_108;
  undefined1 local_c0 [48];
  undefined1 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_10c = 0xaaaaaaaa;
  pMVar13 = pCtx->pOut;
  db = pMVar13->db;
  uVar3 = jsonbPayloadSize(pParse,i,&local_10c);
  uVar2 = local_10c;
  if (uVar3 == 0) {
    pCtx->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3VdbeMemSetStr
                (pMVar13,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    goto LAB_001bd50c;
  }
  puVar1 = pParse->aBlob;
  uVar14 = local_10c;
  switch(puVar1[i] & 0xf) {
  case 0:
    if (local_10c != 0) break;
    if ((pMVar13->flags & 0x9000) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        vdbeMemClearExternAndSetNull(pMVar13);
        return;
      }
      goto LAB_001bd50c;
    }
    pMVar13->flags = 1;
    goto LAB_001bd39d;
  case 1:
    if (local_10c == 0) {
      if ((pMVar13->flags & 0x9000) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          val = 1;
LAB_001bd46b:
          vdbeReleaseAndSetInt64(pMVar13,val);
          return;
        }
        goto LAB_001bd50c;
      }
      (pMVar13->u).r = 4.94065645841247e-324;
LAB_001bd4eb:
      pMVar13->flags = 4;
      goto LAB_001bd39d;
    }
    break;
  case 2:
    if (local_10c == 0) {
      if ((pMVar13->flags & 0x9000) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          val = 0;
          goto LAB_001bd46b;
        }
        goto LAB_001bd50c;
      }
      (pMVar13->u).r = 0.0;
      goto LAB_001bd4eb;
    }
    break;
  case 3:
  case 4:
    local_c0._0_8_ = (sqlite3_context *)0x0;
    if (local_10c != 0) {
      uVar6 = (ulong)(uVar3 + i);
      uVar10 = puVar1[uVar6];
      if (uVar10 == '-') {
        if (local_10c == 1) break;
        uVar6 = (ulong)(uVar3 + i + 1);
        uVar3 = uVar3 + 1;
        uVar14 = local_10c - 1;
      }
      pcVar7 = sqlite3DbStrNDup(db,(char *)(puVar1 + uVar6),(long)(int)uVar14);
      if (pcVar7 != (char *)0x0) {
        iVar4 = sqlite3DecOrHexToI64(pcVar7,(i64 *)local_c0);
        sqlite3DbFreeNN(db,pcVar7);
        if (iVar4 == 0) {
          val_00 = (sqlite3_context *)-local_c0._0_8_;
          if (uVar10 != '-') {
            val_00 = (sqlite3_context *)local_c0._0_8_;
          }
        }
        else {
          if ((uVar10 != '-') || (iVar4 != 3)) {
            if ((uVar10 == '-') && (iVar4 != 1)) {
              uVar3 = uVar3 - 1;
              uVar14 = uVar14 + 1;
            }
            else if (iVar4 == 1) {
              pMVar13 = pCtx->pOut;
              break;
            }
LAB_001bcf9b:
            pcVar7 = sqlite3DbStrNDup(db,(char *)(pParse->aBlob + (uVar3 + i)),(long)(int)uVar14);
            if (pcVar7 != (char *)0x0) {
              sVar8 = strlen(pcVar7);
              iVar4 = sqlite3AtoF(pcVar7,&local_118,(uint)sVar8 & 0x3fffffff,'\x01');
              sqlite3DbFreeNN(db,pcVar7);
              pMVar13 = pCtx->pOut;
              if (0 < iVar4) {
                sqlite3VdbeMemSetDouble(pMVar13,local_118);
                goto LAB_001bd39d;
              }
              break;
            }
            goto LAB_001bd393;
          }
          val_00 = (sqlite3_context *)0x8000000000000000;
        }
        pMVar13 = pCtx->pOut;
        if ((pMVar13->flags & 0x9000) == 0) {
          (pMVar13->u).i = (i64)val_00;
          pMVar13->flags = 4;
        }
        else {
          vdbeReleaseAndSetInt64(pMVar13,(i64)val_00);
        }
        goto LAB_001bd39d;
      }
      goto LAB_001bd393;
    }
    break;
  case 5:
  case 6:
    local_118 = -NAN;
    if (local_10c != 0) goto LAB_001bcf9b;
    break;
  case 7:
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001bd50c;
    z = puVar1 + (uVar3 + i);
    uVar10 = '\x01';
    goto LAB_001bd0f8;
  case 8:
  case 9:
    if (db == (sqlite3 *)0x0) {
      z = (u8 *)sqlite3Malloc((ulong)(local_10c + 1));
    }
    else {
      z = (u8 *)sqlite3DbMallocRawNN(db,(ulong)(local_10c + 1));
    }
    if (z != (u8 *)0x0) {
      if (uVar2 == 0) {
        uVar6 = 0;
      }
      else {
        uVar14 = 0;
        uVar16 = 0;
        do {
          uVar15 = (uint)uVar16;
          if (puVar1[(ulong)uVar14 + (ulong)(uVar3 + i)] == '\\') {
            local_c0._0_4_ = 0xaaaaaaaa;
            uVar5 = jsonUnescapeOneChar((char *)(puVar1 + (ulong)uVar14 + (ulong)(uVar3 + i)),
                                        uVar2 - uVar14,(u32 *)local_c0);
            if ((uint)local_c0._0_4_ < 0x80) {
              iVar4 = 1;
              uVar12 = uVar15;
              uVar11 = local_c0._0_4_;
LAB_001bd303:
              uVar16 = (ulong)(uVar15 + iVar4);
              z[uVar12] = (u8)uVar11;
            }
            else {
              bVar9 = (byte)local_c0._0_8_;
              if ((uint)local_c0._0_4_ < 0x800) {
                uVar12 = uVar15 + 1;
                z[uVar16] = (byte)((uint)local_c0._0_4_ >> 6) | 0xc0;
                uVar11 = (uint)(bVar9 & 0x3f | 0x80);
                iVar4 = 2;
                goto LAB_001bd303;
              }
              if ((uint)local_c0._0_4_ < 0x10000) {
                z[uVar16] = (byte)((uint)local_c0._0_4_ >> 0xc) | 0xe0;
                uVar12 = uVar15 + 2;
                z[uVar15 + 1] = (byte)((uint)local_c0._0_4_ >> 6) & 0x3f | 0x80;
                uVar11 = (uint)(bVar9 & 0x3f | 0x80);
                iVar4 = 3;
                goto LAB_001bd303;
              }
              if (local_c0._0_4_ != 0x99999) {
                z[uVar16] = (byte)((uint)local_c0._0_4_ >> 0x12) | 0xf0;
                z[uVar15 + 1] = (byte)((uint)local_c0._0_4_ >> 0xc) & 0x3f | 0x80;
                uVar12 = uVar15 + 3;
                z[uVar15 + 2] = (byte)((uint)local_c0._0_4_ >> 6) & 0x3f | 0x80;
                uVar11 = (uint)(bVar9 & 0x3f | 0x80);
                iVar4 = 4;
                goto LAB_001bd303;
              }
            }
            uVar14 = (uVar14 + uVar5) - 1;
            uVar6 = uVar16;
          }
          else {
            uVar6 = (ulong)(uVar15 + 1);
            z[uVar16] = puVar1[(ulong)uVar14 + (ulong)(uVar3 + i)];
          }
          uVar14 = uVar14 + 1;
          uVar16 = uVar6;
        } while (uVar14 < uVar2);
      }
      uVar14 = (uint)uVar6;
      z[uVar6] = '\0';
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001bd50c;
      xDel = sqlite3OomClear;
      uVar10 = '\x01';
      goto LAB_001bd3ff;
    }
LAB_001bd393:
    sqlite3_result_error_nomem(pCtx);
    goto LAB_001bd39d;
  case 0xb:
  case 0xc:
    z = puVar1 + i;
    if ((textOnly != 0) || (((ulong)pCtx->pFunc->pUserData & 8) == 0)) {
      local_c0._8_8_ = local_c0 + 0x22;
      local_c0._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_108.zJson = (char *)0x0;
      local_108.db = (sqlite3 *)0x0;
      local_108.nJson = 0;
      local_108.nJPRef = 0;
      local_108.iErr = 0;
      local_108.iDepth = 0;
      local_108.nErr = '\0';
      local_108.oom = '\0';
      local_108.bJsonIsRCStr = '\0';
      local_108.hasNonstd = '\0';
      local_108.bReadOnly = '\0';
      local_108.eEdit = '\0';
      local_108.delta = 0;
      local_108.nIns = 0;
      local_108.iLabel = 0;
      local_108.aIns = (u8 *)0x0;
      local_108.nBlobAlloc = 0;
      local_108.nBlob = local_10c + uVar3;
      local_c0._16_8_ = 100;
      local_c0._24_8_ = 0;
      local_c0[0x20] = '\x01';
      local_c0[0x21] = '\0';
      local_c0[0x22] = -0x56;
      local_c0[0x23] = -0x56;
      local_c0[0x24] = -0x56;
      local_c0[0x25] = -0x56;
      local_c0[0x26] = -0x56;
      local_c0[0x27] = -0x56;
      local_108.aBlob = z;
      local_c0._0_8_ = pCtx;
      jsonTranslateBlobToText(&local_108,0,(JsonString *)local_c0);
      jsonReturnString((JsonString *)local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
      goto LAB_001bd39d;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001bd50c;
    uVar10 = '\0';
    uVar14 = local_10c + uVar3;
LAB_001bd0f8:
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_001bd3ff:
    setResultStrOrError(pCtx,(char *)z,uVar14,uVar10,xDel);
    return;
  }
  pCtx->isError = 1;
  sqlite3VdbeMemSetStr(pMVar13,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
  ;
LAB_001bd39d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001bd50c:
  __stack_chk_fail();
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}